

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileCollectingErrors
          (DescriptorPool *this,FileDescriptorProto *proto,ErrorCollector *error_collector)

{
  LogMessage *pLVar1;
  FileDescriptor *pFVar2;
  LogFinisher local_e1;
  undefined1 local_e0 [56];
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  _Rb_tree_node_base local_70;
  size_t local_50;
  FileDescriptor *pFStack_48;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9d0);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_e0,"CHECK failed: fallback_database_ == NULL: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    internal::LogFinisher::operator=(&local_e1,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
  }
  if (this->mutex_ != (Mutex *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
               ,0x9d4);
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)local_e0,"CHECK failed: mutex_ == NULL: ");
    internal::LogFinisher::operator=(&local_e1,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
  }
  local_e0._8_8_ = (this->tables_).ptr_;
  local_a8._M_p = (pointer)local_98;
  local_e0._24_8_ = (pointer)0x0;
  local_e0[0x20] = 0;
  local_e0._33_7_ = 0;
  local_e0[0x28] = '\0';
  local_e0._41_8_ = 0;
  local_a0 = 0;
  local_98[0]._M_local_buf[0] = '\0';
  local_70._M_left = &local_70;
  local_70._M_color = _S_red;
  local_70._M_parent = (_Base_ptr)0x0;
  local_40._M_p = (pointer)&local_30;
  local_50 = 0;
  pFStack_48 = (FileDescriptor *)0x0;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_e0._0_8_ = this;
  local_e0._16_8_ = error_collector;
  local_70._M_right = local_70._M_left;
  pFVar2 = DescriptorBuilder::BuildFile((DescriptorBuilder *)local_e0,proto);
  DescriptorBuilder::~DescriptorBuilder((DescriptorBuilder *)local_e0);
  return pFVar2;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileCollectingErrors(
    const FileDescriptorProto& proto,
    ErrorCollector* error_collector) {
  GOOGLE_CHECK(fallback_database_ == NULL)
    << "Cannot call BuildFile on a DescriptorPool that uses a "
       "DescriptorDatabase.  You must instead find a way to get your file "
       "into the underlying database.";
  GOOGLE_CHECK(mutex_ == NULL);   // Implied by the above GOOGLE_CHECK.
  return DescriptorBuilder(this, tables_.get(),
                           error_collector).BuildFile(proto);
}